

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O3

string * __thiscall
cmsys::RegularExpression::match_abi_cxx11_
          (string *__return_storage_ptr__,RegularExpression *this,int n)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = this->startp[n];
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
  }
  else {
    pcVar1 = this->endp[n];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline kwsys_stl::string RegularExpression::match(int n) const
{
  if (this->startp[n]==0)
    {
    return kwsys_stl::string("");
    }
  else
    {
    return kwsys_stl::string(this->startp[n],
                             static_cast<kwsys_stl::string::size_type>(
                               this->endp[n] - this->startp[n]));
    }
}